

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::ProcessHorizontal(Clipper *this,TEdge *horzEdge)

{
  double dVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  TEdge **ppTVar5;
  clipperException *this_00;
  TEdge *pTVar6;
  TEdge *pTVar7;
  TEdge *pTVar8;
  TEdge **ppTVar9;
  IntersectProtects protects;
  long lVar10;
  long64 *plVar11;
  TEdge *pTVar12;
  TEdge *pTVar13;
  int iVar14;
  IntPoint local_70;
  long local_60;
  long local_58;
  TEdge *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_58 = horzEdge->xcurr;
  local_60 = horzEdge->xtop;
  local_48 = local_60;
  if (local_58 < local_60) {
    local_48 = local_58;
  }
  local_40 = local_60;
  if (local_60 < local_58) {
    local_40 = local_58;
  }
  if (horzEdge->nextInLML == (TEdge *)0x0) {
    pTVar13 = horzEdge->next;
    if ((((pTVar13 == (TEdge *)0x0) || (pTVar13->ytop != horzEdge->ytop)) ||
        (pTVar13->nextInLML != (TEdge *)0x0)) || (pTVar13->xtop != local_60)) {
      pTVar13 = horzEdge->prev;
    }
  }
  else {
    pTVar13 = (TEdge *)0x0;
  }
  local_38 = (ulong)(local_60 <= local_58) * 8 + 0x70;
  pTVar12 = (&horzEdge->nextInAEL)[local_60 <= local_58];
  local_50 = horzEdge;
  do {
    pTVar8 = local_50;
    if (pTVar12 == (TEdge *)0x0) goto LAB_00686a89;
    pTVar7 = *(TEdge **)((long)&pTVar12->xbot + local_38);
    if (pTVar13 == (TEdge *)0x0) {
      if (local_58 < local_60) {
        if (pTVar12->xcurr <= local_40) goto LAB_006866cf;
LAB_00686891:
        if ((pTVar12->xcurr <= local_40) || (iVar14 = 3, this->m_SortedEdges == (TEdge *)0x0)) {
          if (local_60 <= local_58) goto LAB_006868be;
          goto LAB_00686a70;
        }
        goto LAB_00686a76;
      }
      if (local_48 <= pTVar12->xcurr) goto LAB_006866cf;
      if (local_58 < local_60) goto LAB_00686891;
LAB_006868be:
      if ((pTVar12->xcurr < local_48) && (iVar14 = 3, this->m_SortedEdges != (TEdge *)0x0))
      goto LAB_00686a76;
LAB_00686a70:
      iVar14 = 0;
      pTVar12 = pTVar7;
    }
    else {
LAB_006866cf:
      if ((pTVar13 == (TEdge *)0x0) && (pTVar12->xcurr == local_50->xtop)) {
        if (local_50->nextInLML == (TEdge *)0x0) {
          __assert_fail("horzEdge->nextInLML",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/clipper/clipper.cpp"
                        ,0x947,"void ClipperLib::Clipper::ProcessHorizontal(TEdge *)");
        }
        bVar4 = SlopesEqual(pTVar12,local_50->nextInLML,
                            (bool)(this->_vptr_Clipper[-3] + 0x10)
                                  [(long)&(this->m_PolyOuts).
                                          super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                  ]);
        if (bVar4) {
          iVar14 = 3;
          if ((-1 < pTVar8->outIdx) && (-1 < pTVar12->outIdx)) {
            AddJoin(this,pTVar8->nextInLML,pTVar12,pTVar8->outIdx,-1);
          }
        }
        else {
          dVar1 = pTVar8->nextInLML->dx;
          iVar14 = 3;
          if (dVar1 < pTVar12->dx || dVar1 == pTVar12->dx) goto LAB_0068678a;
        }
      }
      else {
LAB_0068678a:
        if (pTVar12 != pTVar13) {
          if ((1e-20 <= ABS(pTVar12->dx + 1e+40)) ||
             (((pTVar12->prev->nextInLML != pTVar12 && (pTVar12->next->nextInLML != pTVar12)) ||
              (local_70.X = pTVar12->xcurr, pTVar12->xtop < local_70.X)))) {
            if (local_60 <= local_58) {
              local_70.X = pTVar12->xcurr;
              local_70.Y = pTVar8->ycurr;
              for (pTVar6 = this->m_SortedEdges; bVar4 = pTVar6 == (TEdge *)0x0, !bVar4;
                  pTVar6 = pTVar6->nextInSEL) {
                lVar2 = pTVar6->xcurr;
                lVar3 = pTVar6->xtop;
                lVar10 = lVar2;
                if (lVar3 < lVar2) {
                  lVar10 = lVar3;
                }
                if (lVar10 <= local_70.X) {
                  plVar11 = &pTVar6->xcurr;
                  if (lVar2 < lVar3) {
                    plVar11 = &pTVar6->xtop;
                  }
                  if (local_70.X <= *plVar11) break;
                }
              }
              goto LAB_00686a41;
            }
            local_70.X = pTVar12->xcurr;
            local_70.Y = pTVar8->ycurr;
            for (pTVar6 = this->m_SortedEdges; bVar4 = pTVar6 == (TEdge *)0x0, !bVar4;
                pTVar6 = pTVar6->nextInSEL) {
              lVar2 = pTVar6->xcurr;
              lVar3 = pTVar6->xtop;
              lVar10 = lVar2;
              if (lVar3 < lVar2) {
                lVar10 = lVar3;
              }
              if (lVar10 <= local_70.X) {
                plVar11 = &pTVar6->xcurr;
                if (lVar2 < lVar3) {
                  plVar11 = &pTVar6->xtop;
                }
                if (local_70.X <= *plVar11) break;
              }
            }
LAB_006869d8:
            protects = ((byte)~bVar4 & 1) * 2 + ipLeft;
            pTVar6 = pTVar12;
          }
          else {
            if (local_58 < local_60) {
              local_70.Y = pTVar8->ycurr;
              for (pTVar6 = this->m_SortedEdges; bVar4 = pTVar6 == (TEdge *)0x0, !bVar4;
                  pTVar6 = pTVar6->nextInSEL) {
                lVar2 = pTVar6->xcurr;
                lVar3 = pTVar6->xtop;
                lVar10 = lVar2;
                if (lVar3 < lVar2) {
                  lVar10 = lVar3;
                }
                if (lVar10 <= local_70.X) {
                  plVar11 = &pTVar6->xcurr;
                  if (lVar2 < lVar3) {
                    plVar11 = &pTVar6->xtop;
                  }
                  if (local_70.X <= *plVar11) break;
                }
              }
              goto LAB_006869d8;
            }
            local_70.Y = pTVar8->ycurr;
            for (pTVar6 = this->m_SortedEdges; bVar4 = pTVar6 == (TEdge *)0x0, !bVar4;
                pTVar6 = pTVar6->nextInSEL) {
              lVar2 = pTVar6->xcurr;
              lVar3 = pTVar6->xtop;
              lVar10 = lVar2;
              if (lVar3 < lVar2) {
                lVar10 = lVar3;
              }
              if (lVar10 <= local_70.X) {
                plVar11 = &pTVar6->xcurr;
                if (lVar2 < lVar3) {
                  plVar11 = &pTVar6->xtop;
                }
                if (local_70.X <= *plVar11) break;
              }
            }
LAB_00686a41:
            protects = bVar4 ^ ipBoth;
            pTVar6 = pTVar8;
            pTVar8 = pTVar12;
          }
          IntersectEdges(this,pTVar8,pTVar6,&local_70,protects);
          SwapPositionsInAEL(this,local_50,pTVar12);
          goto LAB_00686a70;
        }
        if (local_58 < local_60) {
          local_70.X = pTVar12->xcurr;
          local_70.Y = pTVar8->ycurr;
          pTVar7 = pTVar12;
        }
        else {
          local_70.X = pTVar12->xcurr;
          local_70.Y = pTVar8->ycurr;
          pTVar7 = pTVar8;
          pTVar8 = pTVar12;
        }
        IntersectEdges(this,pTVar8,pTVar7,&local_70,ipNone);
        iVar14 = 1;
        if (-1 < pTVar13->outIdx) {
          this_00 = (clipperException *)__cxa_allocate_exception(0x28);
          clipperException::clipperException(this_00,"ProcessHorizontal error");
          goto LAB_00686bca;
        }
      }
    }
LAB_00686a76:
  } while (iVar14 == 0);
  if (iVar14 == 3) {
LAB_00686a89:
    if (local_50->nextInLML == (TEdge *)0x0) {
      if (-1 < local_50->outIdx) {
        local_70.Y = local_50->ycurr;
        local_70.X = local_50->xtop;
        IntersectEdges(this,local_50,pTVar13,&local_70,ipBoth);
      }
      if (pTVar13 == (TEdge *)0x0) {
        __assert_fail("eMaxPair",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/clipper/clipper.cpp"
                      ,0x988,"void ClipperLib::Clipper::ProcessHorizontal(TEdge *)");
      }
      if (-1 < pTVar13->outIdx) {
        this_00 = (clipperException *)__cxa_allocate_exception(0x28);
        clipperException::clipperException(this_00,"ProcessHorizontal error");
LAB_00686bca:
        __cxa_throw(this_00,&clipperException::typeinfo,clipperException::~clipperException);
      }
      pTVar12 = pTVar13->nextInAEL;
      pTVar8 = pTVar13->prevInAEL;
      ppTVar5 = &this->m_ActiveEdges;
      if (((pTVar8 != (TEdge *)0x0) || (pTVar12 != (TEdge *)0x0)) ||
         (this->m_ActiveEdges == pTVar13)) {
        ppTVar9 = &pTVar8->nextInAEL;
        if (pTVar8 == (TEdge *)0x0) {
          ppTVar9 = ppTVar5;
        }
        *ppTVar9 = pTVar12;
        if (pTVar12 != (TEdge *)0x0) {
          pTVar12->prevInAEL = pTVar8;
        }
        pTVar13->nextInAEL = (TEdge *)0x0;
        pTVar13->prevInAEL = (TEdge *)0x0;
      }
      pTVar13 = local_50->nextInAEL;
      pTVar12 = local_50->prevInAEL;
      if (((pTVar12 != (TEdge *)0x0) || (pTVar13 != (TEdge *)0x0)) || (*ppTVar5 == local_50)) {
        if (pTVar12 != (TEdge *)0x0) {
          ppTVar5 = &pTVar12->nextInAEL;
        }
        *ppTVar5 = pTVar13;
        if (pTVar13 != (TEdge *)0x0) {
          pTVar13->prevInAEL = pTVar12;
        }
        local_50->nextInAEL = (TEdge *)0x0;
        local_50->prevInAEL = (TEdge *)0x0;
      }
    }
    else {
      if (-1 < local_50->outIdx) {
        local_70.X = local_50->xtop;
        local_70.Y = local_50->ytop;
        AddOutPt(this,local_50,&local_70);
      }
      UpdateEdgeIntoAEL(this,&local_50);
    }
  }
  return;
}

Assistant:

void Clipper::ProcessHorizontal(TEdge *horzEdge)
{
  Direction dir;
  long64 horzLeft, horzRight;

  if( horzEdge->xcurr < horzEdge->xtop )
  {
    horzLeft = horzEdge->xcurr;
    horzRight = horzEdge->xtop;
    dir = dLeftToRight;
  } else
  {
    horzLeft = horzEdge->xtop;
    horzRight = horzEdge->xcurr;
    dir = dRightToLeft;
  }

  TEdge* eMaxPair;
  if( horzEdge->nextInLML ) eMaxPair = 0;
  else eMaxPair = GetMaximaPair(horzEdge);

  TEdge* e = GetNextInAEL( horzEdge , dir );
  while( e )
  {
    TEdge* eNext = GetNextInAEL( e, dir );

    if (eMaxPair ||
      ((dir == dLeftToRight) && (e->xcurr <= horzRight)) ||
      ((dir == dRightToLeft) && (e->xcurr >= horzLeft)))
    {
      //ok, so far it looks like we're still in range of the horizontal edge
      if ( e->xcurr == horzEdge->xtop && !eMaxPair )
      {
        assert(horzEdge->nextInLML);
        if (SlopesEqual(*e, *horzEdge->nextInLML, m_UseFullRange))
        {
          //if output polygons share an edge, they'll need joining later ...
          if (horzEdge->outIdx >= 0 && e->outIdx >= 0)
            AddJoin(horzEdge->nextInLML, e, horzEdge->outIdx);
          break; //we've reached the end of the horizontal line
        }
        else if (e->dx < horzEdge->nextInLML->dx)
        //we really have got to the end of the intermediate horz edge so quit.
        //nb: More -ve slopes follow more +ve slopes ABOVE the horizontal.
          break;
      }

      if( e == eMaxPair )
      {
        //horzEdge is evidently a maxima horizontal and we've arrived at its end.
        if (dir == dLeftToRight)
          IntersectEdges(horzEdge, e, IntPoint(e->xcurr, horzEdge->ycurr), ipNone);
        else
          IntersectEdges(e, horzEdge, IntPoint(e->xcurr, horzEdge->ycurr), ipNone);
        if (eMaxPair->outIdx >= 0) throw clipperException("ProcessHorizontal error");
        return;
      }
      else if( NEAR_EQUAL(e->dx, HORIZONTAL) &&  !IsMinima(e) && !(e->xcurr > e->xtop) )
      {
        //An overlapping horizontal edge. Overlapping horizontal edges are
        //processed as if layered with the current horizontal edge (horizEdge)
        //being infinitesimally lower that the next (e). Therfore, we
        //intersect with e only if e.xcurr is within the bounds of horzEdge ...
        if( dir == dLeftToRight )
          IntersectEdges( horzEdge , e, IntPoint(e->xcurr, horzEdge->ycurr),
            (IsTopHorz( e->xcurr ))? ipLeft : ipBoth );
        else
          IntersectEdges( e, horzEdge, IntPoint(e->xcurr, horzEdge->ycurr),
            (IsTopHorz( e->xcurr ))? ipRight : ipBoth );
      }
      else if( dir == dLeftToRight )
      {
        IntersectEdges( horzEdge, e, IntPoint(e->xcurr, horzEdge->ycurr),
          (IsTopHorz( e->xcurr ))? ipLeft : ipBoth );
      }
      else
      {
        IntersectEdges( e, horzEdge, IntPoint(e->xcurr, horzEdge->ycurr),
          (IsTopHorz( e->xcurr ))? ipRight : ipBoth );
      }
      SwapPositionsInAEL( horzEdge, e );
    }
    else if( (dir == dLeftToRight && e->xcurr > horzRight  && m_SortedEdges) ||
     (dir == dRightToLeft && e->xcurr < horzLeft && m_SortedEdges) ) break;
    e = eNext;
  } //end while

  if( horzEdge->nextInLML )
  {
    if( horzEdge->outIdx >= 0 )
      AddOutPt( horzEdge, IntPoint(horzEdge->xtop, horzEdge->ytop));
    UpdateEdgeIntoAEL( horzEdge );
  }
  else
  {
    if ( horzEdge->outIdx >= 0 )
      IntersectEdges( horzEdge, eMaxPair,
      IntPoint(horzEdge->xtop, horzEdge->ycurr), ipBoth);
    assert(eMaxPair);
    if (eMaxPair->outIdx >= 0) throw clipperException("ProcessHorizontal error");
    DeleteFromAEL(eMaxPair);
    DeleteFromAEL(horzEdge);
  }
}